

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFireFightingFactored.cpp
# Opt level: O2

void __thiscall
ProblemFireFightingFactored::ConstructObservations(ProblemFireFightingFactored *this)

{
  ostream *poVar1;
  long lVar2;
  uint AI;
  string whatObs;
  string descr;
  string name;
  stringstream ss;
  allocator<char> local_229;
  ProblemFireFightingFactored *local_228;
  MADPComponentDiscreteObservations *local_220;
  undefined1 *local_218;
  undefined8 local_210;
  undefined1 local_208 [16];
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [8];
  string local_1a0 [368];
  
  local_220 = &(this->super_FactoredDecPOMDPDiscrete).
               super_MultiAgentDecisionProcessDiscreteFactoredStates._m_O;
  local_228 = this;
  for (AI = 0; (ulong)AI < *(ulong *)&(local_228->super_FactoredDecPOMDPDiscrete).field_0x708;
      AI = AI + 1) {
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      local_218 = local_208;
      local_210 = 0;
      local_208[0] = 0;
      std::__cxx11::string::assign((char *)&local_218);
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::operator<<(local_1a8,(string *)&local_218);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"",&local_229);
      std::__cxx11::stringbuf::str(local_1a0);
      std::__cxx11::string::~string((string *)&local_1f8);
      poVar1 = std::operator<<(local_1a8,"Observation ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      poVar1 = std::operator<<(poVar1," of agent ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      poVar1 = std::operator<<(poVar1,": ");
      std::operator<<(poVar1,(string *)&local_218);
      std::__cxx11::stringbuf::str();
      MADPComponentDiscreteObservations::AddObservation(local_220,AI,&local_1d8,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::__cxx11::string::~string((string *)&local_218);
    }
  }
  return;
}

Assistant:

void ProblemFireFightingFactored::ConstructObservations()
{
    /// add observations:
    for(Index agentIndex=0; agentIndex < _m_nrAgents; agentIndex++)
    {
        size_t nrObservationsThisAgent = 2; //flames or no flames
//         _m_nrObservations.push_back(nrObservationsThisAgent);
//         _m_observationVecs.push_back( vector<ObservationDiscrete>() );
        for(Index obsI=0; obsI < nrObservationsThisAgent; obsI++)
        {

            string whatObs;
            switch(obsI){
            case(FLAMES):    whatObs = "Flames__";
                break;
            case(NOFLAMES):    whatObs = "NoFlames";
                break;
            }
            stringstream ss;
            //ss << "Ag" <<agentIndex << ":" << whatObs;
            ss << whatObs;
            string name = ss.str();
            ss.str("");
            ss << "Observation " << obsI << " of agent " << agentIndex << ": " << whatObs;
            string descr = ss.str();
//             ObservationDiscrete od_temp = ObservationDiscrete(obsI,name,descr);
//             _m_observationVecs[agentIndex].push_back( od_temp );
            AddObservation(agentIndex,name,descr);
        }
    }
}